

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall
perfetto::protos::gen::AndroidEnergyConsumer::Serialize(AndroidEnergyConsumer *this,Message *msg)

{
  bool bVar1;
  void *data;
  size_t size;
  Message *msg_local;
  AndroidEnergyConsumer *this_local;
  
  bVar1 = std::bitset<5UL>::operator[](&this->_has_field_,1);
  if (bVar1) {
    protozero::Message::AppendVarInt<int>(msg,1,this->energy_consumer_id_);
  }
  bVar1 = std::bitset<5UL>::operator[](&this->_has_field_,2);
  if (bVar1) {
    protozero::Message::AppendVarInt<int>(msg,2,this->ordinal_);
  }
  bVar1 = std::bitset<5UL>::operator[](&this->_has_field_,3);
  if (bVar1) {
    protozero::Message::AppendString(msg,3,&this->type_);
  }
  bVar1 = std::bitset<5UL>::operator[](&this->_has_field_,4);
  if (bVar1) {
    protozero::Message::AppendString(msg,4,&this->name_);
  }
  data = (void *)::std::__cxx11::string::data();
  size = ::std::__cxx11::string::size();
  protozero::Message::AppendRawProtoBytes(msg,data,size);
  return;
}

Assistant:

void AndroidEnergyConsumer::Serialize(::protozero::Message* msg) const {
  // Field 1: energy_consumer_id
  if (_has_field_[1]) {
    msg->AppendVarInt(1, energy_consumer_id_);
  }

  // Field 2: ordinal
  if (_has_field_[2]) {
    msg->AppendVarInt(2, ordinal_);
  }

  // Field 3: type
  if (_has_field_[3]) {
    msg->AppendString(3, type_);
  }

  // Field 4: name
  if (_has_field_[4]) {
    msg->AppendString(4, name_);
  }

  msg->AppendRawProtoBytes(unknown_fields_.data(), unknown_fields_.size());
}